

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

void __thiscall
TEST_CommandLineArguments_setStrictNameFilter_TestShell::
~TEST_CommandLineArguments_setStrictNameFilter_TestShell
          (TEST_CommandLineArguments_setStrictNameFilter_TestShell *this)

{
  TEST_CommandLineArguments_setStrictNameFilter_TestShell *this_local;
  
  ~TEST_CommandLineArguments_setStrictNameFilter_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CommandLineArguments, setStrictNameFilter)
{
    int argc = 3;
    const char* argv[] = { "tests.exe", "-sn", "name" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter nameFilter("name");
    nameFilter.strictMatching();
    CHECK_EQUAL(nameFilter, *args->getNameFilters());
}